

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_multi_getBytes_Test::
ByteBufferTest_test_multi_getBytes_Test(ByteBufferTest_test_multi_getBytes_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00269a48;
  return;
}

Assistant:

TEST(ByteBufferTest, test_multi_getBytes)
{
    ByteBuffer byte_buffer = ByteBuffer(12);
    std::string input = "abc";
    byte_buffer.WriteBytes((uint8_t*) &input[0], 3);
    char output[3];
    byte_buffer.ReadBytes((uint8_t*) output, 3);
    std::string result(output, 3);

    ASSERT_EQ("abc", result);
}